

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNpn2.c
# Opt level: O3

void Dtt_PrintMulti(Dtt_Man_t *p)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  int *piVar8;
  ulong uVar9;
  int *__s;
  int Counts [13] [15];
  int local_348 [198];
  
  __s = local_348;
  memset(__s,0,0x30c);
  uVar9 = 0;
  while( true ) {
    iVar1 = p->nClasses;
    if ((long)iVar1 < 1) {
      return;
    }
    piVar3 = p->pNodes;
    lVar7 = 0;
    uVar6 = 0;
    iVar5 = 0;
    do {
      if (uVar9 == (uint)piVar3[lVar7]) {
        uVar2 = p->pTimes[lVar7];
        if (0x4000 < uVar2) {
          __assert_fail("Log < 15",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauNpn2.c"
                        ,0x298,"void Dtt_PrintMulti(Dtt_Man_t *)");
        }
        uVar4 = 0x1f;
        if (uVar2 - 1 != 0) {
          for (; uVar2 - 1 >> uVar4 == 0; uVar4 = uVar4 - 1) {
          }
        }
        piVar8 = (int *)((ulong)((uVar4 ^ 0x3fffffe0) * 4 + 0x84) + (long)(local_348 + uVar9 * 0xf))
        ;
        if (uVar2 < 2) {
          piVar8 = local_348 + uVar9 * 0xf;
        }
        *piVar8 = *piVar8 + 1;
        iVar5 = iVar5 + uVar2;
        uVar6 = uVar6 + 1;
      }
      lVar7 = lVar7 + 1;
    } while (iVar1 != lVar7);
    if (uVar6 == 0) break;
    printf("n=%2d : ",uVar9 & 0xffffffff);
    printf("All = %7d  ",(ulong)uVar6);
    printf("Ave = %6.2f  ",(double)iVar5 / (double)(int)uVar6);
    lVar7 = 0;
    do {
      if (__s[lVar7] == 0) {
        printf("%6s","");
      }
      else {
        printf("%6d");
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0xf);
    putchar(10);
    uVar9 = uVar9 + 1;
    __s = __s + 0xf;
    if (uVar9 == 0xd) {
      return;
    }
  }
  return;
}

Assistant:

void Dtt_PrintMulti( Dtt_Man_t * p )
{
    int n, Counts[13][15] = {{0}};
    for ( n = 0; n < 13; n++ )
    {
        int i, Total = 0, Count = 0;
        for ( i = 0; i < p->nClasses; i++ )
            if ( p->pNodes[i] == n )
            {
                int Log = Abc_Base2Log(p->pTimes[i]);
                assert( Log < 15 );
                if ( p->pTimes[i] < 2 )
                    Counts[n][0]++;
                else
                    Counts[n][Log]++;
                Total += p->pTimes[i];
                Count++;
            }
        if ( Count == 0 )
            break;
        printf( "n=%2d : ", n );
        printf( "All = %7d  ", Count );
        printf( "Ave = %6.2f  ", 1.0*Total/Count );
        for ( i = 0; i < 15; i++ )
            if ( Counts[n][i] )
                printf( "%6d", Counts[n][i] );
            else
                printf( "%6s", "" );
        printf( "\n" );
    }
}